

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bencode.hpp
# Opt level: O3

int libtorrent::detail::write_integer<char*,long,void>(char **out,long data)

{
  integer_type in_RCX;
  size_t sVar1;
  char *pcVar2;
  span<char> buf_00;
  string_view sVar3;
  char buf [21];
  detail adStack_28 [32];
  
  buf_00.m_len = data;
  buf_00.m_ptr = (char *)0x15;
  sVar3 = integer_to_str(adStack_28,buf_00,in_RCX);
  if (sVar3.len_ != 0) {
    pcVar2 = *out;
    sVar1 = 0;
    do {
      *pcVar2 = sVar3.ptr_[sVar1];
      pcVar2 = *out + 1;
      *out = pcVar2;
      sVar1 = sVar1 + 1;
    } while (sVar3.len_ != sVar1);
  }
  return (int)sVar3.len_;
}

Assistant:

int write_integer(OutIt& out, In data)
		{
			entry::integer_type const val = entry::integer_type(data);
			TORRENT_ASSERT(data == In(val));
			// the stack allocated buffer for keeping the
			// decimal representation of the number can
			// not hold number bigger than this:
			static_assert(sizeof(entry::integer_type) <= 8, "64 bit integers required");
			static_assert(sizeof(data) <= sizeof(entry::integer_type), "input data too big, see entry::integer_type");
			char buf[21];
			auto const str = integer_to_str(buf, val);
			for (char const c : str)
			{
				*out = c;
				++out;
			}
			return static_cast<int>(str.size());
		}